

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_conn.c
# Opt level: O0

void ares_conn_sock_state_cb_update(ares_conn_t *conn,ares_conn_state_flags_t flags)

{
  ares_channel_t *paVar1;
  ares_channel_t *channel;
  ares_conn_state_flags_t flags_local;
  ares_conn_t *conn_local;
  
  paVar1 = conn->server->channel;
  if (((conn->state_flags & ARES_CONN_STATE_CBFLAGS) != flags) &&
     (paVar1->sock_state_cb != (ares_sock_state_cb)0x0)) {
    (*paVar1->sock_state_cb)
              (paVar1->sock_state_cb_data,conn->fd,
               SUB14((flags & ARES_CONN_STATE_READ) != ARES_CONN_STATE_NONE,0),
               SUB14((flags & ARES_CONN_STATE_WRITE) != ARES_CONN_STATE_NONE,0));
  }
  conn->state_flags = conn->state_flags & ~ARES_CONN_STATE_CBFLAGS;
  conn->state_flags = flags | conn->state_flags;
  return;
}

Assistant:

void ares_conn_sock_state_cb_update(ares_conn_t            *conn,
                                    ares_conn_state_flags_t flags)
{
  ares_channel_t *channel = conn->server->channel;

  if ((conn->state_flags & ARES_CONN_STATE_CBFLAGS) != flags &&
      channel->sock_state_cb) {
    channel->sock_state_cb(channel->sock_state_cb_data, conn->fd,
                           flags & ARES_CONN_STATE_READ ? 1 : 0,
                           flags & ARES_CONN_STATE_WRITE ? 1 : 0);
  }

  conn->state_flags &= ~((unsigned int)ARES_CONN_STATE_CBFLAGS);
  conn->state_flags |= flags;
}